

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O2

void render_obj(gba_ppu_t *ppu)

{
  int iVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  short sVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  short sVar20;
  ushort uVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  short sVar27;
  uint uVar28;
  ulong uVar29;
  short sVar30;
  uint uVar31;
  int sprite_x;
  int iVar32;
  int iVar33;
  ushort uVar34;
  ushort uVar35;
  uint uVar36;
  int local_a8;
  short local_6c;
  
  for (lVar19 = 0x26162; lVar19 != 0x26252; lVar19 = lVar19 + 1) {
    *(undefined1 *)((long)(ppu->screen + -1) + 0x3be + lVar19) = 0;
    (&ppu->screen[0][0x77].g)[lVar19] = '\0';
    *(ushort *)((long)ppu + lVar19 * 2 + -0x26342) = *(ushort *)ppu->pram | 0x8000;
  }
  uVar2 = ppu->y;
  uVar15 = (uint)uVar2;
  lVar19 = 0;
  do {
    if (lVar19 == 0x80) {
      return;
    }
    uVar3 = *(ushort *)(ppu->oam + lVar19 * 8);
    uVar4 = *(ushort *)(ppu->oam + lVar19 * 8 + 2);
    uVar29 = (ulong)(uVar3 >> 10 & 0xfffffff0);
    iVar7 = *(int *)((long)sprite_heights[0] + (ulong)(uVar4 >> 0xe) * 4 + uVar29);
    iVar16 = iVar7 / 2;
    uVar35 = uVar3 >> 8 & 3;
    sVar20 = 0;
    uVar25 = uVar3 & 0xff;
    iVar26 = 0;
    if (uVar35 == 3) {
      iVar26 = iVar16;
    }
    iVar8 = iVar26 + uVar25;
    iVar26 = iVar26 + -0x100 + uVar25;
    if (iVar8 < 0xa0) {
      iVar26 = iVar8;
    }
    uVar17 = uVar15 - iVar26;
    uVar25 = ~uVar17 + iVar7;
    if ((uVar4 >> 0xd & 1) == 0) {
      uVar25 = uVar17;
    }
    if (uVar35 == 1) {
      uVar25 = uVar17;
    }
    if (uVar35 == 3) {
      uVar25 = uVar17;
    }
    iVar8 = *(int *)((long)sprite_widths[0] + (ulong)(uVar4 >> 0xe) * 4 + uVar29);
    iVar33 = iVar8 / 2;
    iVar32 = 0;
    if (uVar35 == 3) {
      iVar32 = iVar33;
    }
    iVar22 = iVar32 + (uVar4 & 0x1ff);
    iVar9 = iVar32 + -0x200 + (uVar4 & 0x1ff);
    if (iVar22 < 0xf0) {
      iVar9 = iVar22;
    }
    iVar23 = iVar26 + iVar7;
    iVar22 = iVar9 + iVar8;
    local_a8 = iVar9;
    if ((uVar35 | 2) == 3) {
      uVar29 = (ulong)(uVar4 >> 4 & 0x3e0);
      sVar14 = *(short *)(ppu->oam + uVar29 + 6);
      sVar20 = *(short *)(ppu->oam + uVar29 + 0xe);
      sVar27 = *(short *)(ppu->oam + uVar29 + 0x16);
      sVar30 = *(short *)(ppu->oam + uVar29 + 0x1e);
      if (uVar35 == 3) {
        iVar26 = iVar26 - iVar16;
        iVar23 = iVar23 + iVar16;
        local_a8 = iVar9 + iVar33 * -2;
        if (local_a8 < 1) {
          local_a8 = 0;
        }
        iVar22 = iVar22 + iVar33 * 2;
        if (iVar22 < 0xf1) {
          iVar22 = 0xf0;
        }
      }
    }
    else {
      sVar14 = 0xff;
      sVar27 = 0;
      sVar30 = 0xff;
    }
    if (((uVar35 != 2) && (iVar26 <= (int)uVar15)) && ((int)uVar15 < iVar23)) {
      uVar5 = *(ushort *)(ppu->oam + lVar19 * 8 + 4);
      uVar17 = -iVar33;
      if (uVar35 != 3) {
        uVar17 = 0;
      }
      uVar24 = uVar3 & 0x2000;
      uVar34 = uVar3 >> 10 & 3;
      iVar23 = (uVar17 - iVar33) * (int)sVar27 + (int)sVar30 * (uVar25 - iVar16);
      iVar26 = (uVar17 - iVar33) * (int)sVar14 + (int)sVar20 * (uVar25 - iVar16);
      uVar28 = ~uVar17 + iVar8;
      for (; (int)uVar17 < iVar32 + iVar8; uVar17 = uVar17 + 1) {
        if ((uVar35 | 2) == 3) {
          uVar36 = (iVar26 >> 8) + iVar33;
          if (((int)uVar36 < iVar8 && -1 < (int)uVar36) &&
             (uVar18 = (iVar23 >> 8) + iVar16, (int)uVar18 < iVar7 && -1 < (int)uVar18))
          goto LAB_00113b9b;
        }
        else {
          uVar36 = uVar17;
          uVar18 = uVar25;
          if ((uVar4 >> 0xc & 1) != 0) {
            uVar36 = uVar28;
          }
LAB_00113b9b:
          uVar6 = (ppu->DISPCNT).raw;
          iVar10 = (int)uVar18 / 8 << 5;
          if ((uVar6 & 0x40) != 0) {
            iVar10 = ((int)uVar18 / 8 << ((byte)(uVar3 >> 0xd) & 1)) * (iVar8 / 8);
          }
          uVar31 = iVar9 + uVar17;
          if (((uVar31 < 0xf0) && (local_a8 <= (int)uVar31)) &&
             (((int)uVar31 < iVar22 &&
              (((short)ppu->objbuf[uVar31].raw < 0 ||
               ((uVar5 >> 10 & 3) < (ushort)ppu->obj_priorities[uVar31])))))) {
            iVar1 = (int)uVar36 % 8 + ((int)uVar18 % 8) * 8;
            uVar18 = (uint)ppu->vram[(iVar1 >> ((uVar3 & 0x2000) == 0)) +
                                     (((int)uVar36 / 8 << (sbyte)(uVar24 >> 0xd)) + (uVar5 & 0x3ff)
                                     + iVar10) * 0x20 + 0x10000];
            local_6c = (short)uVar24;
            if (local_6c == 0) {
              bVar12 = ppu->vram[(iVar1 >> ((uVar3 & 0x2000) == 0)) +
                                 (((int)uVar36 / 8 << (sbyte)(uVar24 >> 0xd)) + (uVar5 & 0x3ff) +
                                 iVar10) * 0x20 + 0x10000] >> ((char)(iVar1 % 2) * '\x04' & 0x1fU);
              if ((bVar12 & 0xf) != 0) {
                uVar18 = (uVar5 >> 7 & 0xffffffe0) + (bVar12 & 0xf) * 2 >> 1;
                goto LAB_00113c94;
              }
            }
            else if (uVar18 != 0) {
LAB_00113c94:
              if (uVar34 == 2) {
                ppu->obj_window[uVar31] = true;
              }
              else {
                if ((byte)(ppu->WIN0H).raw < uVar31 || uVar31 < (ppu->WIN0H).raw >> 8) {
                  bVar13 = false;
                }
                else {
                  bVar13 = uVar2 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar2;
                }
                if ((byte)(ppu->WIN1H).raw < uVar31 || uVar31 < (ppu->WIN1H).raw >> 8) {
                  bVar11 = false;
                }
                else {
                  bVar11 = uVar2 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar2;
                }
                uVar21 = (ppu->WININ).raw;
                bVar12 = (byte)(uVar6 >> 8);
                if ((bVar12 >> 5 & 1 & bVar13) == 0) {
                  if (((bVar12 >> 6 & 1 & bVar11) != 0) ||
                     ((uVar21 = (ppu->WINOUT).raw, (short)uVar6 < 0 &&
                      (ppu->obj_window[uVar31] != false)))) {
                    uVar21 = uVar21 & 0x1000;
                    goto LAB_00113d7a;
                  }
                  if (((bVar13 == false && bVar11 == false) && ((byte)uVar21 >> 4 & 1) == 0) &&
                      (uVar6 & 0x6000) != 0) goto LAB_00113db0;
                }
                else {
                  uVar21 = uVar21 & 0x10;
LAB_00113d7a:
                  if (uVar21 == 0) goto LAB_00113db0;
                }
                ppu->obj_priorities[uVar31] = (byte)(uVar5 >> 10) & 3;
                ppu->obj_alpha[uVar31] = uVar34 == 1;
                ppu->objbuf[uVar31].raw =
                     *(ushort *)(ppu->pram + (ulong)uVar18 * 2 + 0x200) & 0x7fff;
              }
            }
          }
        }
LAB_00113db0:
        uVar28 = uVar28 - 1;
        iVar23 = iVar23 + sVar27;
        iVar26 = iVar26 + sVar14;
      }
    }
    lVar19 = lVar19 + 1;
  } while( true );
}

Assistant:

void render_obj(gba_ppu_t* ppu) {
    obj_attr0_t attr0;
    obj_attr1_t attr1;
    obj_attr2_t attr2;

    clear_obj(ppu);

    for (int sprite = 0; sprite < 128; sprite++) {
        attr0.raw = half_from_byte_array(ppu->oam, (sprite * 8) + 0);
        attr1.raw = half_from_byte_array(ppu->oam, (sprite * 8) + 2);
        attr2.raw = half_from_byte_array(ppu->oam, (sprite * 8) + 4);

        int height = sprite_heights[attr0.shape][attr1.size];
        int width = sprite_widths[attr0.shape][attr1.size];
        int tiles_wide = width / 8;

        int hheight = height / 2;
        int hwidth = width / 2;

        bool is_double_affine = attr0.affine_object_mode == OBJ_AFF_MODE_DOUBLE;
        bool is_affine = attr0.affine_object_mode == OBJ_AFF_MODE_AFFINE || is_double_affine;

        int adjusted_x = attr1.x;
        int adjusted_y = attr0.y;

        if (is_double_affine) {
            adjusted_x += hwidth;
            adjusted_y += hheight;
        }

        if (adjusted_x >= 240) {
            adjusted_x -= 512;
        }
        if (adjusted_y >= 160) {
            adjusted_y -= 256;
        }

        int sprite_y = ppu->y - adjusted_y;
        if (!is_affine && attr1.vflip) {
            sprite_y = height - sprite_y - 1;
        }

        int screen_min_y = adjusted_y;
        int screen_max_y = adjusted_y + height;

        int screen_min_x = adjusted_x;
        int screen_max_x = adjusted_x + width;


        obj_affine_t affine;
        if (is_affine) {
            affine.pa = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 6);
            affine.pb = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 14);
            affine.pc = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 22);
            affine.pd = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 30);
            if (is_double_affine) { // double rendering area
                screen_min_y -= hheight;
                screen_max_y += hheight;

                screen_min_x -= hwidth;
                screen_max_x += hwidth;

                screen_min_x -= (width / 2);
                if (screen_min_x < 0) {
                    screen_min_x = 0;
                }
                screen_max_x += (width / 2);
                if (screen_max_x < GBA_SCREEN_X) {
                    screen_max_x = GBA_SCREEN_X;
                }
            }

        } else {
            // Set to identity matrix
            affine.pa = 0xFF;
            affine.pb = 0x00;
            affine.pc = 0x00;
            affine.pd = 0xFF;
        }

        if (ppu->y >= screen_min_y && ppu->y < screen_max_y) { // If the sprite is visible, we should draw it.
            if (attr0.affine_object_mode != OBJ_AFF_MODE_HIDE) { // Not disabled
                int sprite_x_start = is_double_affine ? -hwidth : 0;
                int sprite_x_end   = is_double_affine ? width + hwidth : width;
                for (int sprite_x = sprite_x_start; sprite_x < sprite_x_end; sprite_x++) {
                    int adjusted_sprite_x = sprite_x;
                    int adjusted_sprite_y = sprite_y;

                    if (is_affine) {
                        adjusted_sprite_x = affine.pa * (sprite_x - hwidth) + affine.pb * (sprite_y - hheight);
                        adjusted_sprite_x >>= 8;
                        adjusted_sprite_x += hwidth;

                        if (adjusted_sprite_x >= width || adjusted_sprite_x < 0) {
                            continue;
                        }

                        adjusted_sprite_y = affine.pc * (sprite_x - hwidth) + affine.pd * (sprite_y - hheight);
                        adjusted_sprite_y >>= 8;
                        adjusted_sprite_y += hheight;

                        if (adjusted_sprite_y >= height || adjusted_sprite_y < 0) {
                            continue;
                        }

                    } else if (attr1.hflip) {
                        adjusted_sprite_x = width - sprite_x - 1;
                    }

                    int y_tid_offset;
                    int sprite_tile_y = adjusted_sprite_y / 8;
                    if (ppu->DISPCNT.obj_character_vram_mapping) { // 1D
                        // Tiles are twice as wide in 256 color mode
                        y_tid_offset = tiles_wide * (sprite_tile_y << attr0.is_256color);
                    } else { // 2D
                        y_tid_offset = 32 * sprite_tile_y;
                    }
                    // After adding this offset, we won't need to worry about 1D vs 2D,
                    // because in either case they'll be right next to each other in memory.
                    int tid = attr2.tid + y_tid_offset;

                    // Don't use the adjusted X or Y here. There'd be no point in transforming the sprite, otherwise.
                    int screen_x = sprite_x + adjusted_x;
                    // Only draw if we've never drawn anything there before. Lower indices have higher priority
                    // and that's the order we're drawing them here.
                    if (screen_x < GBA_SCREEN_X && screen_x >= 0 && screen_x >= screen_min_x && screen_x < screen_max_x && (ppu->objbuf[screen_x].transparent || attr2.priority < ppu->obj_priorities[screen_x])) {
                        // Tiles are twice as wide in 256 color mode
                        int x_tid_offset = (adjusted_sprite_x / 8) << attr0.is_256color;
                        int tid_offset_by_x = tid + x_tid_offset;
                        word tile_address = 0x10000 + tid_offset_by_x * OBJ_TILE_SIZE;

                        int in_tile_x = adjusted_sprite_x % 8;
                        int in_tile_y = adjusted_sprite_y % 8;

                        int in_tile_offset = in_tile_x + in_tile_y * 8;
                        tile_address += in_tile_offset >> (!attr0.is_256color);

                        byte tile = ppu->vram[tile_address];
                        if (!attr0.is_256color) {
                            tile >>= (in_tile_offset % 2) * 4;
                            tile &= 0xF;
                        }

                        if (tile != 0) {

                            word palette_address = 0x200; // OBJ palette base
                            if (attr0.is_256color) {
                                palette_address += 2 * tile;
                            } else {
                                palette_address += (0x20 * attr2.pb + 2 * tile);
                            }
                            if (attr0.graphics_mode == OBJ_MODE_OBJWIN) {
                                ppu->obj_window[screen_x] = true;
                            } else {
                                if (should_render_pixel_window(ppu, screen_x, ppu->y, ppu->WININ.win0_obj_enable, ppu->WININ.win1_obj_enable, ppu->WINOUT.outside_obj_enable, ppu->WINOUT.obj_obj_enable)) {
                                    ppu->obj_priorities[screen_x] = attr2.priority;
                                    ppu->obj_alpha[screen_x] = attr0.graphics_mode == OBJ_MODE_ALPHA;
                                    ppu->objbuf[screen_x].raw = half_from_byte_array(ppu->pram, palette_address);
                                    ppu->objbuf[screen_x].transparent = false;
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}